

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_bang.c
# Opt level: O2

void bng_set(t_bng *x)

{
  int iVar1;
  int iVar2;
  double dVar3;
  double dVar4;
  
  iVar1 = x->x_flashtime_hold;
  dVar3 = clock_gettimesince(x->x_lastflashtime);
  dVar4 = clock_getsystime();
  x->x_lastflashtime = dVar4;
  iVar2 = (int)dVar3 / 2;
  if (x->x_flashtime_hold * 2 <= (int)dVar3) {
    iVar2 = iVar1;
  }
  if (iVar2 <= x->x_flashtime_break) {
    iVar2 = x->x_flashtime_break;
  }
  x->x_flashed = 1;
  (*(x->x_gui).x_draw)(x,(x->x_gui).x_glist,0);
  clock_delay(x->x_clock_hld,(double)iVar2);
  return;
}

Assistant:

static void bng_set(t_bng *x)
{
    int holdtime = x->x_flashtime_hold;
    int sincelast = clock_gettimesince(x->x_lastflashtime);
    x->x_lastflashtime = clock_getsystime();
    if (sincelast < x->x_flashtime_hold*2)
        holdtime = sincelast/2;
    if (holdtime < x->x_flashtime_break)
        holdtime = x->x_flashtime_break;
    x->x_flashed = 1;
    (*x->x_gui.x_draw)(x, x->x_gui.x_glist, IEM_GUI_DRAW_MODE_UPDATE);
    clock_delay(x->x_clock_hld, holdtime);
}